

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O3

void __thiscall
duckdb::WriteAheadLog::WriteAlter(WriteAheadLog *this,CatalogEntry *entry,AlterInfo *info)

{
  BinarySerializer *this_00;
  bool bVar1;
  int iVar2;
  pointer this_01;
  UniqueConstraint *this_02;
  CatalogEntry *pCVar3;
  undefined4 extraout_var;
  DataTableInfo *pDVar4;
  string name;
  WriteAheadLogSerializer serializer;
  string local_5f8;
  WriteAheadLogSerializer local_5d8;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&local_5d8,this,ALTER_INFO);
  this_00 = &local_5d8.serializer;
  (*local_5d8.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x65,"info");
  Serializer::WriteValue<duckdb::AlterInfo>(&this_00->super_Serializer,info);
  (*local_5d8.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  bVar1 = AlterInfo::IsAddPrimaryKey(info);
  if (bVar1) {
    this_01 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
              operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                          *)(info + 1));
    this_02 = Constraint::Cast<duckdb::UniqueConstraint>(this_01);
    pCVar3 = CatalogEntry::Parent(entry);
    iVar2 = (*pCVar3->_vptr_CatalogEntry[0x10])(pCVar3);
    pDVar4 = shared_ptr<duckdb::DataTableInfo,_true>::operator->
                       ((shared_ptr<duckdb::DataTableInfo,_true> *)
                        (CONCAT44(extraout_var,iVar2) + 0x18));
    UniqueConstraint::GetName(&local_5f8,this_02,&pCVar3->name);
    SerializeIndex(this->database,&local_5d8,&pDVar4->indexes,&local_5f8);
    BinarySerializer::OnObjectEnd(this_00);
    ChecksumWriter::Flush(&local_5d8.checksum_writer);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p);
    }
  }
  else {
    BinarySerializer::OnObjectEnd(this_00);
    ChecksumWriter::Flush(&local_5d8.checksum_writer);
  }
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&local_5d8);
  return;
}

Assistant:

void WriteAheadLog::WriteAlter(CatalogEntry &entry, const AlterInfo &info) {
	WriteAheadLogSerializer serializer(*this, WALType::ALTER_INFO);
	serializer.WriteProperty(101, "info", &info);

	if (!info.IsAddPrimaryKey()) {
		return serializer.End();
	}

	auto &table_info = info.Cast<AlterTableInfo>();
	auto &constraint_info = table_info.Cast<AddConstraintInfo>();
	auto &unique = constraint_info.constraint->Cast<UniqueConstraint>();

	auto &table_entry = entry.Cast<DuckTableEntry>();
	auto &parent = table_entry.Parent().Cast<DuckTableEntry>();
	auto &parent_info = parent.GetStorage().GetDataTableInfo();
	auto &list = parent_info->GetIndexes();

	auto name = unique.GetName(parent.name);
	SerializeIndex(database, serializer, list, name);
	serializer.End();
}